

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TDeletingArray<SortNode_*,_SortNode_*>::~TDeletingArray
          (TDeletingArray<SortNode_*,_SortNode_*> *this)

{
  uint uVar1;
  SortNode **ppSVar2;
  uint local_14;
  uint i;
  TDeletingArray<SortNode_*,_SortNode_*> *this_local;
  
  for (local_14 = 0;
      uVar1 = TArray<SortNode_*,_SortNode_*>::Size(&this->super_TArray<SortNode_*,_SortNode_*>),
      local_14 < uVar1; local_14 = local_14 + 1) {
    ppSVar2 = TArray<SortNode_*,_SortNode_*>::operator[]
                        (&this->super_TArray<SortNode_*,_SortNode_*>,(ulong)local_14);
    if (*ppSVar2 != (SortNode *)0x0) {
      ppSVar2 = TArray<SortNode_*,_SortNode_*>::operator[]
                          (&this->super_TArray<SortNode_*,_SortNode_*>,(ulong)local_14);
      if (*ppSVar2 != (SortNode *)0x0) {
        operator_delete(*ppSVar2,0x30);
      }
    }
  }
  TArray<SortNode_*,_SortNode_*>::~TArray(&this->super_TArray<SortNode_*,_SortNode_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}